

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

bool __thiscall
MlmWrap::checkBrokerConnected(MlmWrap *this,char *endpoint,int tries,mlm_client_t *temp,int timeout)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  
  cVar1 = mlm_client_connected(temp);
  bVar3 = true;
  if (cVar1 == '\0') {
    iVar2 = mlm_client_connect(temp,endpoint,1000,"temp");
    while (iVar2 < 0) {
      tries = tries + -1;
      if (tries == 0) {
        iVar2 = 1;
        break;
      }
      zclock_sleep(100);
      iVar2 = mlm_client_connect(temp,endpoint,1000,"temp");
    }
    bVar3 = iVar2 == 0;
    this->connected = bVar3;
  }
  return bVar3;
}

Assistant:

bool MlmWrap::checkBrokerConnected(const char *endpoint, int tries, mlm_client_t* temp, int timeout) {
    bool retval = false;
    int rc = -1;

    if(mlm_client_connected(temp)) //Passed in temp is already connected and verified
        return true;
    while((rc = mlm_client_connect(temp, endpoint, 1000, TEMP_NETWORK_ID)) < 0 && --tries){
        zclock_sleep(100);
    }
    if (rc == 0) {
        retval = true;
    }
    else {
        retval = false;
    }
    connected = retval;
    return(retval);
}